

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_setenv_ex
              (LIBSSH2_CHANNEL *channel,char *varname,uint varname_len,char *value,uint value_len)

{
  uchar uVar1;
  LIBSSH2_SESSION *session;
  int iVar2;
  time_t start_time;
  uchar *puVar3;
  char *errmsg;
  ulong uVar4;
  uchar *s;
  uchar *local_70;
  ulong local_68;
  ulong local_60;
  packet_requirev_state_t *local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  uchar *data;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_50 = varname;
    local_48 = value;
    start_time = time((time_t *)0x0);
    uVar4 = (ulong)(varname_len + value_len + 0x15);
    local_70 = channel->setenv_local_channel;
    local_58 = &channel->setenv_packet_requirev_state;
    local_68 = (ulong)value_len;
    local_60 = (ulong)varname_len;
    do {
      session = channel->session;
      if (channel->setenv_state == libssh2_NB_state_idle) {
        channel->setenv_packet_len = uVar4;
        (channel->setenv_packet_requirev_state).start = 0;
        puVar3 = (uchar *)(*session->alloc)(uVar4,&session->abstract);
        channel->setenv_packet = puVar3;
        if (puVar3 != (uchar *)0x0) {
          s = puVar3 + 1;
          *puVar3 = 'b';
          _libssh2_store_u32(&s,(channel->remote).id);
          _libssh2_store_str(&s,"env",3);
          *s = '\x01';
          s = s + 1;
          _libssh2_store_str(&s,local_50,local_60);
          _libssh2_store_str(&s,local_48,local_68);
          channel->setenv_state = libssh2_NB_state_created;
          goto LAB_0010a616;
        }
        iVar2 = -6;
        errmsg = "Unable to allocate memory for setenv packet";
        s = (uchar *)0x0;
LAB_0010a7ab:
        iVar2 = _libssh2_error(session,iVar2,errmsg);
      }
      else {
LAB_0010a616:
        if (channel->setenv_state != libssh2_NB_state_created) {
LAB_0010a698:
          if (channel->setenv_state == libssh2_NB_state_sent) {
            iVar2 = _libssh2_packet_requirev(session,"cd",&data,&local_40,1,local_70,4,local_58);
            if (iVar2 == -0x25) goto LAB_0010a7b2;
            if (iVar2 == 0) {
              if (local_40 != 0) {
                uVar1 = *data;
                (*session->free)(data,&session->abstract);
                if (uVar1 != 'c') goto LAB_0010a716;
                channel->setenv_state = libssh2_NB_state_idle;
                iVar2 = 0;
                goto LAB_0010a7b2;
              }
              channel->setenv_state = libssh2_NB_state_idle;
              iVar2 = -0xe;
              errmsg = "Unexpected packet size";
            }
            else {
              channel->setenv_state = libssh2_NB_state_idle;
              errmsg = "Failed getting response for channel-setenv";
            }
          }
          else {
LAB_0010a716:
            channel->setenv_state = libssh2_NB_state_idle;
            iVar2 = -0x16;
            errmsg = "Unable to complete request for channel-setenv";
          }
          goto LAB_0010a7ab;
        }
        iVar2 = _libssh2_transport_send
                          (session,channel->setenv_packet,channel->setenv_packet_len,(uchar *)0x0,0)
        ;
        if (iVar2 == 0) {
          (*session->free)(channel->setenv_packet,&session->abstract);
          channel->setenv_packet = (uchar *)0x0;
          _libssh2_htonu32(local_70,(channel->local).id);
          channel->setenv_state = libssh2_NB_state_sent;
          goto LAB_0010a698;
        }
        if (iVar2 != -0x25) {
          (*session->free)(channel->setenv_packet,&session->abstract);
          channel->setenv_packet = (uchar *)0x0;
          channel->setenv_state = libssh2_NB_state_idle;
          iVar2 = -7;
          errmsg = "Unable to send channel-request packet for setenv request";
          goto LAB_0010a7ab;
        }
        iVar2 = -0x25;
        _libssh2_error(session,-0x25,"Would block sending setenv request");
      }
LAB_0010a7b2:
      if (iVar2 != -0x25) {
        return iVar2;
      }
      if (channel->session->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(channel->session,start_time);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_channel_setenv_ex(LIBSSH2_CHANNEL *channel,
                          const char *varname, unsigned int varname_len,
                          const char *value, unsigned int value_len)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 channel_setenv(channel, varname, varname_len,
                                value, value_len));
    return rc;
}